

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendStamp.hpp
# Opt level: O0

void __thiscall OpenMD::BendStamp::setMembers(BendStamp *this,tuple<int,_int,_int> *tuple)

{
  vector<int,_std::allocator<int>_> *this_00;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *__x;
  type_conflict *third;
  type_conflict *second;
  type_conflict *first;
  
  std::get<0ul,int,int,int>((tuple<int,_int,_int> *)0x38c5a6);
  this_00 = (vector<int,_std::allocator<int>_> *)
            std::get<1ul,int,int,int>((tuple<int,_int,_int> *)0x38c5b5);
  __x = std::get<2ul,int,int,int>((tuple<int,_int,_int> *)0x38c5c4);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  return;
}

Assistant:

void setMembers(const std::tuple<int, int, int>& tuple) {
      auto [first, second, third] = tuple;

      members_.push_back(first);
      members_.push_back(second);
      members_.push_back(third);
    }